

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileChangeHandler.cpp
# Opt level: O0

void __thiscall
FileChangeHandler::registerCapabilities(FileChangeHandler *this,ServerCapabilities *capabilities)

{
  bool bVar1;
  TextDocumentSyncOptions *pTVar2;
  TextDocumentSyncOptions *textSync;
  optional<Init::TextDocumentSyncOptions> local_50;
  ServerCapabilities *local_18;
  ServerCapabilities *capabilities_local;
  FileChangeHandler *this_local;
  
  local_18 = capabilities;
  capabilities_local = (ServerCapabilities *)this;
  bVar1 = ::optional::operator_cast_to_bool((optional *)&capabilities->textDocumentSync);
  if (!bVar1) {
    memset(&textSync,0,0x30);
    Init::TextDocumentSyncOptions::TextDocumentSyncOptions((TextDocumentSyncOptions *)&textSync);
    optional<Init::TextDocumentSyncOptions>::optional
              (&local_50,(TextDocumentSyncOptions *)&textSync);
    optional<Init::TextDocumentSyncOptions>::operator=(&local_18->textDocumentSync,&local_50);
  }
  pTVar2 = optional<Init::TextDocumentSyncOptions>::operator*(&local_18->textDocumentSync);
  pTVar2->openClose = true;
  pTVar2->change = Incremental;
  pTVar2->willSave = true;
  pTVar2->willSaveWaitUntil = false;
  return;
}

Assistant:

void FileChangeHandler::registerCapabilities (Init::ServerCapabilities &capabilities) {
    if (!capabilities.textDocumentSync) capabilities.textDocumentSync = Init::TextDocumentSyncOptions {};
    auto &textSync = *capabilities.textDocumentSync;

    textSync.openClose = true;
    textSync.change = TextDocumentSyncKind::Incremental;
    textSync.willSave = true;
    textSync.willSaveWaitUntil = false;
}